

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<float> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  ImPlotContext *pIVar12;
  ImDrawIdx IVar13;
  long lVar14;
  bool bVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  lVar14 = (long)(((pGVar7->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  fVar19 = *(float *)((long)pGVar7->Xs + lVar14);
  dVar17 = log10((double)*(float *)((long)pGVar7->Ys + lVar14) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar4 = pTVar8->YAxis;
  pIVar9 = pIVar12->CurrentPlot;
  dVar2 = pIVar9->YAxis[iVar4].Range.Min;
  fVar20 = (float)(((double)fVar19 - (pIVar9->XAxis).Range.Min) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar4].Min.x);
  fVar21 = (float)((((double)(float)(dVar17 / pIVar12->LogDenY[iVar4]) *
                     (pIVar9->YAxis[iVar4].Range.Max - dVar2) + dVar2) - dVar2) * pIVar12->My[iVar4]
                  + (double)pIVar12->PixelRange[iVar4].Min.y);
  fVar19 = (this->P1).x;
  fVar22 = (this->P1).y;
  fVar18 = fVar22;
  if (fVar21 <= fVar22) {
    fVar18 = fVar21;
  }
  bVar15 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(-(uint)(fVar21 <= fVar22) & (uint)fVar22 |
                      ~-(uint)(fVar21 <= fVar22) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar19;
    if (fVar20 <= fVar19) {
      fVar18 = fVar20;
    }
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar20 <= fVar19) & (uint)fVar20 |
                      -(uint)(fVar20 <= fVar19) & (uint)fVar19);
      bVar15 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar18 = this->Weight;
    IVar5 = this->Col;
    IVar3 = *uv;
    fVar19 = fVar20 - fVar19;
    fVar22 = fVar21 - fVar22;
    fVar16 = fVar19 * fVar19 + fVar22 * fVar22;
    if (0.0 < fVar16) {
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      fVar19 = fVar19 * (1.0 / fVar16);
      fVar22 = fVar22 * (1.0 / fVar16);
    }
    fVar18 = fVar18 * 0.5;
    fVar19 = fVar19 * fVar18;
    fVar18 = fVar18 * fVar22;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = (this->P1).x + fVar18;
    (pIVar10->pos).y = (this->P1).y - fVar19;
    pIVar10->uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar18 + fVar20;
    pIVar10[1].pos.y = fVar21 - fVar19;
    pIVar10[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar20 - fVar18;
    pIVar10[2].pos.y = fVar19 + fVar21;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = (this->P1).x - fVar18;
    pIVar10[3].pos.y = fVar19 + (this->P1).y;
    pIVar10[3].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar13 = (ImDrawIdx)uVar6;
    *pIVar11 = IVar13;
    pIVar11[1] = IVar13 + 1;
    pIVar11[2] = IVar13 + 2;
    pIVar11[3] = IVar13;
    pIVar11[4] = IVar13 + 2;
    pIVar11[5] = IVar13 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  IVar3.y = fVar21;
  IVar3.x = fVar20;
  this->P1 = IVar3;
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }